

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::ValueExpressionBase::checkConstantBase(ValueExpressionBase *this,EvalContext *context)

{
  Type *pTVar1;
  DiagCode code;
  
  pTVar1 = (this->super_Expression).type.ptr;
  if (pTVar1->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar1);
  }
  code.subsystem = ConstEval;
  code.code = 5;
  if ((pTVar1->canonical->super_Symbol).kind != ClassType) {
    pTVar1 = (this->super_Expression).type.ptr;
    if (pTVar1->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar1);
    }
    code.subsystem = ConstEval;
    code.code = 6;
    if ((pTVar1->canonical->super_Symbol).kind != CovergroupType) {
      if ((this->symbol->super_Symbol).kind != Specparam) {
        return true;
      }
      code.subsystem = Expressions;
      code.code = 0x99;
      if (((context->flags).m_bits & 4) != 0) {
        return true;
      }
    }
  }
  EvalContext::addDiag(context,code,(this->super_Expression).sourceRange);
  return false;
}

Assistant:

bool ValueExpressionBase::checkConstantBase(EvalContext& context) const {
    // Class types are disallowed in constant expressions. Note that I don't see anything
    // in the spec that would explicitly disallow them, but literally every tool issues
    // an error so for now we will follow suit.
    if (type->isClass()) {
        context.addDiag(diag::ConstEvalClassType, sourceRange);
        return false;
    }

    // Same for covergroups.
    if (type->isCovergroup()) {
        context.addDiag(diag::ConstEvalCovergroupType, sourceRange);
        return false;
    }

    if (symbol.kind == SymbolKind::Specparam && !context.flags.has(EvalFlags::SpecparamsAllowed)) {
        context.addDiag(diag::SpecparamInConstant, sourceRange);
        return false;
    }

    return true;
}